

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O1

Iterator * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++(Iterator *this)

{
  Node *pNVar1;
  _Elt_pointer ppNVar2;
  long lVar3;
  anon_union_8_2_94730038_for_Vector2<long>_3 aVar4;
  
  pNVar1 = *(this->pending).
            super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::pop_front(&this->pending);
  if (pNVar1->before != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&pNVar1->before);
  }
  if (pNVar1->after_or_equal != (Node *)0x0) {
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
    ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
              ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                *)this,&pNVar1->after_or_equal);
  }
  ppNVar2 = (this->pending).
            super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->pending).
      super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppNVar2) {
    pNVar1 = *ppNVar2;
    lVar3 = pNVar1->value;
    aVar4 = (pNVar1->pt).field_1;
    (this->current).first.field_0 = (pNVar1->pt).field_0;
    (this->current).first.field_1 = aVar4;
    (this->current).second = lVar3;
  }
  return this;
}

Assistant:

typename KDTree<CoordType, ValueType>::Iterator&
KDTree<CoordType, ValueType>::Iterator::operator++() {
  const Node* n = this->pending.front();
  this->pending.pop_front();

  if (n->before) {
    this->pending.emplace_back(n->before);
  }
  if (n->after_or_equal) {
    this->pending.emplace_back(n->after_or_equal);
  }

  if (!this->pending.empty()) {
    n = this->pending.front();
    this->current = std::make_pair(n->pt, n->value);
  }

  return *this;
}